

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidgettextcontrol.cpp
# Opt level: O2

void __thiscall QWidgetTextControlPrivate::_q_documentLayoutChanged(QWidgetTextControlPrivate *this)

{
  undefined8 uVar1;
  offset_in_QAbstractTextDocumentLayout_to_subr signal;
  ConnectionType type;
  long in_FS_OFFSET;
  Object local_58 [8];
  Object local_50 [8];
  code *local_48;
  undefined8 uStack_40;
  Object local_38 [8];
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  uVar1 = *(undefined8 *)&this->field_0x8;
  signal = QTextDocument::documentLayout();
  local_48 = QWidgetTextControl::updateRequest;
  uStack_40 = 0;
  type = (ConnectionType)uVar1;
  QObject::
  connect<void(QAbstractTextDocumentLayout::*)(QRectF_const&),void(QWidgetTextControl::*)(QRectF_const&)>
            (local_38,signal,(ContextType *)QAbstractTextDocumentLayout::update,
             (offset_in_QWidgetTextControl_to_subr *)0x0,type);
  QMetaObject::Connection::~Connection((Connection *)local_38);
  local_48 = _q_updateBlock;
  uStack_40 = 0;
  QObjectPrivate::
  connect<void(QAbstractTextDocumentLayout::*)(QTextBlock_const&),void(QWidgetTextControlPrivate::*)(QTextBlock_const&)>
            (local_50,signal,(Object *)QAbstractTextDocumentLayout::updateBlock,0,
             (ConnectionType)this);
  QMetaObject::Connection::~Connection((Connection *)local_50);
  local_48 = QWidgetTextControl::documentSizeChanged;
  uStack_40 = 0;
  QObject::
  connect<void(QAbstractTextDocumentLayout::*)(QSizeF_const&),void(QWidgetTextControl::*)(QSizeF_const&)>
            (local_58,signal,(ContextType *)QAbstractTextDocumentLayout::documentSizeChanged,
             (offset_in_QWidgetTextControl_to_subr *)0x0,type);
  QMetaObject::Connection::~Connection((Connection *)local_58);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QWidgetTextControlPrivate::_q_documentLayoutChanged()
{
    Q_Q(QWidgetTextControl);
    QAbstractTextDocumentLayout *layout = doc->documentLayout();
    QObject::connect(layout, &QAbstractTextDocumentLayout::update, q,
                     &QWidgetTextControl::updateRequest);
    QObjectPrivate::connect(layout, &QAbstractTextDocumentLayout::updateBlock, this,
                            &QWidgetTextControlPrivate::_q_updateBlock);
    QObject::connect(layout, &QAbstractTextDocumentLayout::documentSizeChanged, q,
                     &QWidgetTextControl::documentSizeChanged);
}